

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::Texture3DLodControlCase::init
          (Texture3DLodControlCase *this,EVP_PKEY_CTX *ctx)

{
  uint depth;
  pointer pPVar1;
  uint uVar2;
  int extraout_EAX;
  Texture3D *this_00;
  ulong uVar3;
  int levelNdx;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  deUint32 step;
  Vector<float,_4> res;
  TextureFormatInfo fmtInfo;
  uint local_a8;
  RGBA local_a4;
  ulong local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  Vec4 local_88;
  TextureFormat local_78;
  TextureFormatInfo local_70;
  
  local_78 = glu::mapGLInternalFormat(0x8058);
  tcu::getTextureFormatInfo(&local_70,&local_78);
  uVar4 = this->m_texWidth;
  uVar2 = this->m_texHeight;
  uVar5 = uVar2;
  if ((int)uVar2 < (int)uVar4) {
    uVar5 = uVar4;
  }
  depth = this->m_texDepth;
  if ((int)uVar5 <= (int)depth) {
    uVar5 = depth;
  }
  if (uVar5 == 0) {
    local_a8 = 0x20;
  }
  else {
    local_a8 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> local_a8 == 0; local_a8 = local_a8 - 1) {
      }
    }
    local_a8 = local_a8 ^ 0x1f;
  }
  this_00 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,0x8058,uVar4,uVar2,depth);
  this->m_texture = this_00;
  if (uVar5 != 0) {
    local_a8 = 0x1f - local_a8;
    uVar6 = 0;
    uVar3 = (ulong)local_a8;
    if ((int)local_a8 < 1) {
      uVar3 = uVar6;
    }
    local_a0 = uVar3 * 0x28 + 0x28;
    uVar4 = 0;
    levelNdx = 0;
    do {
      uVar2 = 0xff;
      if (uVar4 < 0xff) {
        uVar2 = uVar4;
      }
      uVar2 = uVar2 * 0x10100 ^ 0xff00ffff;
      if ((int)uVar4 < 0) {
        uVar2 = 0xff00ffff;
      }
      tcu::Texture3D::allocLevel(&this->m_texture->m_refTexture,levelNdx);
      pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_a4.m_value = uVar2;
      tcu::RGBA::toVec(&local_a4);
      local_88.m_data[0] = local_70.lookupScale.m_data[0] * local_98 + local_70.lookupBias.m_data[0]
      ;
      local_88.m_data[1] =
           local_70.lookupScale.m_data[1] * fStack_94 + local_70.lookupBias.m_data[1];
      local_88.m_data[2] =
           local_70.lookupScale.m_data[2] * fStack_90 + local_70.lookupBias.m_data[2];
      local_88.m_data[3] =
           local_70.lookupScale.m_data[3] * fStack_8c + local_70.lookupBias.m_data[3];
      tcu::clear((PixelBufferAccess *)
                 ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + uVar6 + -8),&local_88
                );
      levelNdx = levelNdx + 1;
      uVar4 = uVar4 + (int)(short)(0xff / (int)(short)local_a8);
      uVar6 = uVar6 + 0x28;
    } while (local_a0 != uVar6);
    this_00 = this->m_texture;
  }
  glu::Texture3D::upload(this_00);
  return extraout_EAX;
}

Assistant:

void Texture3DLodControlCase::init (void)
{
	const deUint32					format			= GL_RGBA8;
	const tcu::TextureFormat&		texFmt			= glu::mapGLInternalFormat(format);
	tcu::TextureFormatInfo			fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::Vec4&				cScale			= fmtInfo.lookupScale;
	const tcu::Vec4&				cBias			= fmtInfo.lookupBias;
	int								numLevels		= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth))+1;

	m_texture = new glu::Texture3D(m_context.getRenderContext(), format, m_texWidth, m_texHeight, m_texDepth);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_texture->upload();
}